

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLineOrder.cpp
# Opt level: O0

void anon_unknown.dwarf_242a12::fillPixels(Array2D<Imath_3_2::half> *ph,int width,int height)

{
  int in_EDX;
  int in_ESI;
  Array2D<Imath_3_2::half> *in_RDI;
  float fVar1;
  double dVar2;
  double dVar3;
  int x;
  int y;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_18;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      dVar2 = sin((double)local_18);
      dVar3 = sin((double)local_14 * 0.5);
      fVar1 = (float)(dVar2 + dVar3);
      Imf_3_4::Array2D<Imath_3_2::half>::operator[](in_RDI,(long)local_14);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(fVar1,in_stack_ffffffffffffffe0),(float)((ulong)dVar2 >> 0x20));
    }
  }
  return;
}

Assistant:

void
fillPixels (Array2D<half>& ph, int width, int height)
{
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
            ph[y][x] = x % 10 + 10 * (y % 17);
}